

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall lsim::Simulator::run_until_stable(Simulator *this,size_t stable_ticks)

{
  timestamp_t tVar1;
  timestamp_t *ptVar2;
  timestamp_t *ptVar3;
  timestamp_t *ptVar4;
  timestamp_t *ptVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  
  sVar9 = stable_ticks;
  do {
    step(this);
    tVar1 = this->m_time;
    ptVar4 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    ptVar2 = (this->m_node_change_time).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = (long)ptVar2 - (long)ptVar4;
    if (0 < (long)uVar7 >> 5) {
      ptVar3 = (timestamp_t *)((uVar7 & 0xffffffffffffffe0) + (long)ptVar4);
      lVar6 = ((long)uVar7 >> 5) + 1;
      ptVar5 = ptVar4 + 2;
      do {
        if (ptVar5[-2] == tVar1) {
          ptVar5 = ptVar5 + -2;
          goto LAB_001751e6;
        }
        if (ptVar5[-1] == tVar1) {
          ptVar5 = ptVar5 + -1;
          goto LAB_001751e6;
        }
        if (*ptVar5 == tVar1) goto LAB_001751e6;
        if (ptVar5[1] == tVar1) {
          ptVar5 = ptVar5 + 1;
          goto LAB_001751e6;
        }
        lVar6 = lVar6 + -1;
        ptVar5 = ptVar5 + 4;
      } while (1 < lVar6);
      uVar7 = (long)ptVar2 - (long)ptVar3;
      ptVar4 = ptVar3;
    }
    lVar6 = (long)uVar7 >> 3;
    if (lVar6 == 1) {
LAB_001751ca:
      ptVar5 = ptVar4;
      if (*ptVar4 != tVar1) {
        ptVar5 = ptVar2;
      }
    }
    else if (lVar6 == 2) {
LAB_001751c1:
      ptVar5 = ptVar4;
      if (*ptVar4 != tVar1) {
        ptVar4 = ptVar4 + 1;
        goto LAB_001751ca;
      }
    }
    else {
      ptVar5 = ptVar2;
      if ((lVar6 == 3) && (ptVar5 = ptVar4, *ptVar4 != tVar1)) {
        ptVar4 = ptVar4 + 1;
        goto LAB_001751c1;
      }
    }
LAB_001751e6:
    sVar8 = sVar9 - 1;
    sVar9 = sVar8;
    if (ptVar5 != ptVar2) {
      sVar9 = stable_ticks;
    }
    if (ptVar5 == ptVar2 && sVar8 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void Simulator::run_until_stable(size_t stable_ticks) {
    bool stop = false;
    auto remaining = stable_ticks;

    while (!stop) {
        step();

        bool stable = std::none_of(std::begin(m_node_change_time), std::end(m_node_change_time), 
                            [=] (auto t) {return t == m_time;}
        );

        if (!stable) {
            remaining = stable_ticks;
        } else {
            stop = --remaining == 0;
        }
    }
}